

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

string * __thiscall
kratos::InterfaceDefinition::port
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          uint32_t size,PortDirection dir)

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_5d;
  uint32_t local_5c;
  iterator local_58;
  size_type local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  PortDirection local_2c;
  uint32_t local_28;
  PortDirection dir_local;
  uint32_t size_local;
  uint32_t width_local;
  string *name_local;
  InterfaceDefinition *this_local;
  
  local_58 = &local_5c;
  local_50 = 1;
  local_5c = size;
  local_2c = dir;
  local_28 = size;
  dir_local = width;
  _size_local = name;
  name_local = (string *)this;
  this_local = (InterfaceDefinition *)__return_storage_ptr__;
  std::allocator<unsigned_int>::allocator(&local_5d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_5d);
  port(__return_storage_ptr__,this,name,width,&local_48,local_2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  std::allocator<unsigned_int>::~allocator(&local_5d);
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceDefinition::port(const std::string& name, uint32_t width, uint32_t size,
                                      kratos::PortDirection dir) {
    return port(name, width, std::vector<uint32_t>{size}, dir);
}